

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O1

int Curl_strcasecompare(char *first,char *second)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte bVar4;
  bool bVar5;
  
  bVar2 = *first;
  bVar5 = bVar2 == 0;
  if ((!bVar5) && (bVar4 = *second, bVar4 != 0)) {
    pbVar3 = (byte *)(first + 1);
    pbVar1 = (byte *)(second + 1);
    do {
      second = (char *)pbVar1;
      if (""[bVar2] != ""[bVar4]) {
        return 0;
      }
      bVar2 = *pbVar3;
      bVar5 = bVar2 == 0;
      if (bVar5) break;
      bVar4 = *second;
      pbVar3 = pbVar3 + 1;
      pbVar1 = (byte *)second + 1;
    } while (bVar4 != 0);
  }
  return (int)(byte)(*second != 0U ^ bVar5);
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      return 0;
    first++;
    second++;
  }
  /* If we're here either the strings are the same or the length is different.
     We can just test if the "current" character is non-zero for one and zero
     for the other. Note that the characters may not be exactly the same even
     if they match, we only want to compare zero-ness. */
  return !*first == !*second;
}